

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataSet.cpp
# Opt level: O3

long DataSet::random(void)

{
  result_type_conflict *prVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  int in_ECX;
  long lVar4;
  ulong in_RDX;
  ulong uVar5;
  float *f;
  result_type_conflict *prVar6;
  size_type in_RSI;
  undefined8 *in_RDI;
  DataSet *pDVar7;
  vector<float,_std::allocator<float>_> *c;
  pointer pfVar8;
  result_type_conflict rVar9;
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  vector<float,_std::allocator<float>_> vector;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  aimed_centroids;
  allocator_type local_1422;
  allocator_type local_1421;
  undefined8 *local_1420;
  int local_1414;
  ulong local_1410;
  undefined8 *local_1408;
  vector<float,_std::allocator<float>_> local_1400;
  vector<float,_std::allocator<float>_> local_13e8;
  undefined8 *local_13d0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13c8;
  normal_distribution<float> local_40;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  
  local_1410 = in_RDX;
  local_1408 = in_RDI;
  if (in_ECX == -1) {
    local_13c8._M_x[0] = 1;
    uVar3 = 1;
    lVar4 = 1;
    do {
      uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
      local_13c8._M_x[lVar4] = uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    local_13c8._M_p = 0x270;
    local_40._M_param._M_mean = 0.0;
    local_40._M_param._M_stddev = 1.0;
    local_1420 = (undefined8 *)operator_new(0x30);
    local_1420[1] = 0x100000001;
    *local_1420 = &PTR___Sp_counted_ptr_inplace_00109d10;
    pDVar7 = (DataSet *)(local_1420 + 2);
    local_1420[2] = in_RSI;
    local_1420[3] = 0;
    local_1420[4] = 0;
    local_1420[5] = 0;
    local_1408[1] = local_1420;
    *local_1408 = pDVar7;
    if (local_1410 != 0) {
      uVar3 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_13e8,pDVar7->num_features,(allocator_type *)&local_1400);
        if (pDVar7->num_features != 0) {
          uVar5 = 0;
          do {
            auVar11._0_4_ =
                 std::
                 generate_canonical<float,24ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (&local_13c8);
            auVar11._4_60_ = extraout_var_00;
            auVar2 = vfmadd213ss_fma(auVar11._0_16_,
                                     ZEXT416((uint)(local_40._M_param._M_stddev -
                                                   local_40._M_param._M_mean)),
                                     ZEXT416((uint)local_40._M_param._M_mean));
            local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = auVar2._0_4_;
            uVar5 = uVar5 + 1;
          } while (uVar5 < pDVar7->num_features);
        }
        addVector(pDVar7,&local_13e8);
        if (local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != local_1410);
    }
  }
  else {
    local_13c8._M_x[0] = 1;
    uVar3 = 1;
    lVar4 = 1;
    do {
      uVar3 = (ulong)(((uint)(uVar3 >> 0x1e) ^ (uint)uVar3) * 0x6c078965 + (int)lVar4);
      local_13c8._M_x[lVar4] = uVar3;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x270);
    local_13c8._M_p = 0x270;
    local_40._M_param._M_mean = 0.0;
    local_40._M_param._M_stddev = 1.0;
    local_40._M_saved = 0.0;
    local_40._M_saved_available = false;
    local_1414 = in_ECX;
    std::vector<float,_std::allocator<float>_>::vector(&local_1400,in_RSI,&local_1422);
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
              *)&local_13e8,(long)local_1414,&local_1400,&local_1421);
    local_1420 = (undefined8 *)in_RSI;
    if (local_1400.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_1400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      pfVar8 = local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        prVar1 = *(result_type_conflict **)(pfVar8 + 2);
        for (prVar6 = *(result_type_conflict **)pfVar8; prVar6 != prVar1; prVar6 = prVar6 + 1) {
          rVar9 = std::normal_distribution<float>::operator()
                            (&local_40,&local_13c8,&local_40._M_param);
          *prVar6 = rVar9;
        }
        pfVar8 = pfVar8 + 6;
      } while (pfVar8 != local_13e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_13d0 = (undefined8 *)operator_new(0x30);
    local_13d0[1] = 0x100000001;
    *local_13d0 = &PTR___Sp_counted_ptr_inplace_00109d10;
    pDVar7 = (DataSet *)(local_13d0 + 2);
    local_13d0[2] = local_1420;
    local_13d0[3] = 0;
    local_13d0[4] = 0;
    local_13d0[5] = 0;
    local_1408[1] = local_13d0;
    *local_1408 = pDVar7;
    if (local_1410 != 0) {
      uVar3 = 0;
      do {
        std::vector<float,_std::allocator<float>_>::vector
                  (&local_1400,pDVar7->num_features,&local_1422);
        if (pDVar7->num_features != 0) {
          lVar4 = (long)local_1414;
          uVar5 = 0;
          do {
            local_1420 = (undefined8 *)
                         CONCAT44(local_1420._4_4_,
                                  *(undefined4 *)
                                   (*(long *)(local_13e8.
                                              super__Vector_base<float,_std::allocator<float>_>.
                                              _M_impl.super__Vector_impl_data._M_start +
                                             ((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 |
                                                    uVar3 & 0xffffffff) % lVar4 & 0xffffffffU) * 6)
                                   + uVar5 * 4));
            auVar10._0_4_ =
                 std::normal_distribution<float>::operator()
                           (&local_40,&local_13c8,&local_40._M_param);
            auVar10._4_60_ = extraout_var;
            auVar2 = vfmadd231ss_fma(ZEXT416((uint)local_1420),auVar10._0_16_,ZEXT416(0x3e800000));
            local_1400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5] = auVar2._0_4_;
            uVar5 = uVar5 + 1;
          } while (uVar5 < pDVar7->num_features);
        }
        addVector(pDVar7,&local_1400);
        if (local_1400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1400.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 != local_1410);
    }
    std::
    vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
    ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               *)&local_13e8);
  }
  return (long)local_1408;
}

Assistant:

std::shared_ptr<DataSet> DataSet::random(size_t num_features, size_t num_vectors, int num_clusters) {

  // Fully randomize feature vectors if number of centroids is negative.
  if (num_clusters == -1) {

    UniformRandomGenerator<float> rg(1);

    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  } else {
    NormalRandomGenerator<float> rg(1);
    // Sort of randomize the data to lie around some centroids
    std::vector<std::vector<float>> aimed_centroids(
        static_cast<unsigned long>(num_clusters),
        std::vector<float>(num_features));

    // Generate some random centroids
    for (auto &c : aimed_centroids) {
      for (auto &f: c) {
        f = rg.next();
      }
    }

    // Create a new data set
    auto ds = std::make_shared<DataSet>(num_features);

    for (int i = 0; i < num_vectors; i++) {
      std::vector<float> vector(ds->num_features);
      for (int f = 0; f < ds->num_features; f++) {
        vector[f] = aimed_centroids[i % num_clusters][f] + 0.25f * rg.next();
      }
      ds->addVector(vector);
    }
    return ds;
  }
}